

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O1

void trace2(Abc_Obj_t *pObj)

{
  undefined1 *puVar1;
  Abc_Ntk_t **ppAVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  
  do {
    print_node(pObj);
    lVar4 = (long)(pObj->vFanins).nSize;
    if (lVar4 < 1) {
      return;
    }
    ppAVar2 = &pObj->pNtk;
    pVVar3 = &pObj->vFanins;
    puVar1 = &pObj->field_0x14;
    lVar5 = 0;
    while (pObj = (Abc_Obj_t *)(*ppAVar2)->vObjs->pArray[pVVar3->pArray[lVar5]],
          (int)(*(uint *)&pObj->field_0x14 >> 0xc) < (int)((*(uint *)puVar1 >> 0xc) - 1)) {
      lVar5 = lVar5 + 1;
      if (lVar4 == lVar5) {
        return;
      }
    }
  } while( true );
}

Assistant:

void trace2(Abc_Obj_t *pObj) {
  Abc_Obj_t *pNext;
  int i;

  print_node(pObj);
  Abc_ObjForEachFanin(pObj, pNext, i) 
    if (pNext->Level >= pObj->Level - 1) {
      trace2(pNext);
      break;
    }
}